

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_A_FaceMaster(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  AActor *other;
  bool bVar1;
  bool local_9e;
  bool local_9b;
  TAngle<double> local_98;
  TAngle<double> local_90;
  TAngle<double> local_88;
  TAngle<double> local_80;
  void *local_78;
  double z_add;
  int flags;
  DAngle pitch_offset;
  DAngle ang_offset;
  DAngle max_pitch;
  DAngle max_turn;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xb93,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    self_00 = (AActor *)(param->field_0).field_1.a;
    local_9b = true;
    if (self_00 != (AActor *)0x0) {
      local_9b = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_9b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                    ,0xb93,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
        bVar1 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xb93,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      local_9e = true;
      if (this != (DObject *)0x0) {
        local_9e = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
      }
      if (local_9e == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xb93,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
        bVar1 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xb93,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    TAngle<double>::TAngle(&max_pitch);
    if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
      TAngle<double>::operator=(&max_pitch,0.0);
    }
    else {
      if (param[3].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xb94,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      TAngle<double>::operator=(&max_pitch,param[3].field_0.f);
    }
    TAngle<double>::TAngle(&ang_offset);
    if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
      TAngle<double>::operator=(&ang_offset,270.0);
    }
    else {
      if (param[4].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xb95,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      TAngle<double>::operator=(&ang_offset,param[4].field_0.f);
    }
    TAngle<double>::TAngle(&pitch_offset);
    if ((numparam < 6) || (param[5].field_0.field_3.Type == 0xff)) {
      TAngle<double>::operator=(&pitch_offset,0.0);
    }
    else {
      if (param[5].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xb96,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      TAngle<double>::operator=(&pitch_offset,param[5].field_0.f);
    }
    TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff98);
    if ((numparam < 7) || (param[6].field_0.field_3.Type == 0xff)) {
      TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffff98,0.0);
    }
    else {
      if (param[6].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xb97,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffff98,param[6].field_0.f);
    }
    if ((numparam < 8) || (param[7].field_0.field_3.Type == 0xff)) {
      z_add._4_4_ = 0;
    }
    else {
      if (param[7].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xb98,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      z_add._4_4_ = param[7].field_0.i;
    }
    if ((numparam < 9) || (param[8].field_0.field_3.Type == 0xff)) {
      local_78 = (void *)0x0;
    }
    else {
      if (param[8].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xb99,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      local_78 = param[8].field_0.field_1.a;
    }
    other = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->master);
    TAngle<double>::TAngle(&local_80,&max_pitch);
    TAngle<double>::TAngle(&local_88,&ang_offset);
    TAngle<double>::TAngle(&local_90,&pitch_offset);
    TAngle<double>::TAngle(&local_98,(TAngle<double> *)&stack0xffffffffffffff98);
    A_Face(self_00,other,&local_80,&local_88,&local_90,&local_98,z_add._4_4_,(double)local_78);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                ,0xb93,"int AF_A_FaceMaster(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_FaceMaster)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_ANGLE_OPT(max_turn) { max_turn = 0.; }
	PARAM_ANGLE_OPT(max_pitch) { max_pitch = 270.; }
	PARAM_ANGLE_OPT(ang_offset) { ang_offset = 0.; }
	PARAM_ANGLE_OPT(pitch_offset) { pitch_offset = 0.; }
	PARAM_INT_OPT(flags) { flags = 0; }
	PARAM_FLOAT_OPT(z_add) { z_add = 0; }

	A_Face(self, self->master, max_turn, max_pitch, ang_offset, pitch_offset, flags, z_add);
	return 0;
}